

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O2

void __thiscall
sc_core::sc_vector_base::report_empty_bind(sc_vector_base *this,char *kind_,bool dst_empty_)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  char *local_1c8;
  stringstream str;
  ostream local_198 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  poVar1 = std::operator<<(local_198,"target `");
  poVar1 = std::operator<<(poVar1,(this->super_sc_object).m_name._M_dataplus._M_p);
  poVar1 = std::operator<<(poVar1,"\' ");
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = std::operator<<(poVar1,kind_);
  std::operator<<(poVar1,") ");
  pcVar2 = "empty destination range given";
  if (dst_empty_) {
    pcVar2 = "empty range given";
  }
  pcVar3 = "not initialised yet";
  if ((this->vec_).
      super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->vec_).
      super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar3 = pcVar2;
  }
  std::operator<<(local_198,pcVar3);
  std::__cxx11::stringbuf::str();
  sc_report_handler::report
            (SC_WARNING,"sc_vector::bind called with empty range",local_1c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/utils/sc_vector.cpp"
             ,0x77);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

void
sc_vector_base::report_empty_bind( const char* kind_, bool dst_empty_ ) const
{
  std::stringstream str;

  str << "target `" << name() << "' "
      << "(" << kind_ << ") ";

  if( !size() ) {
    str << "not initialised yet";
  } else if ( dst_empty_ ) {
    str << "empty range given";
  } else {
    str << "empty destination range given";
  }

  SC_REPORT_WARNING( SC_ID_VECTOR_BIND_EMPTY_, str.str().c_str() );
}